

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_xmlSetEntityLoader(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  PyObject *loader;
  PyObject *local_10;
  
  pPVar2 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:libxml_xmlSetEntityLoader",&local_10);
  if (iVar1 != 0) {
    iVar1 = PyCallable_Check(local_10);
    if (iVar1 == 0) {
      PyErr_SetString(_PyExc_ValueError,"entity loader is not callable");
      pPVar2 = (PyObject *)0x0;
    }
    else {
      if (defaultExternalEntityLoader == (xmlExternalEntityLoader)0x0) {
        defaultExternalEntityLoader = (xmlExternalEntityLoader)xmlGetExternalEntityLoader();
      }
      pPVar2 = pythonExternalEntityLoaderObjext;
      if ((pythonExternalEntityLoaderObjext != (PyObject *)0x0) &&
         (pythonExternalEntityLoaderObjext->ob_refcnt =
               pythonExternalEntityLoaderObjext->ob_refcnt + -1, pPVar2->ob_refcnt == 0)) {
        _Py_Dealloc();
      }
      pythonExternalEntityLoaderObjext = local_10;
      if (local_10 != (PyObject *)0x0) {
        local_10->ob_refcnt = local_10->ob_refcnt + 1;
      }
      xmlSetExternalEntityLoader(pythonExternalEntityLoader);
      pPVar2 = (PyObject *)PyLong_FromLong(0);
    }
  }
  return pPVar2;
}

Assistant:

PyObject *
libxml_xmlSetEntityLoader(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) {
    PyObject *py_retval;
    PyObject *loader;

    if (!PyArg_ParseTuple(args, (char *)"O:libxml_xmlSetEntityLoader",
		&loader))
	return(NULL);

    if (!PyCallable_Check(loader)) {
	PyErr_SetString(PyExc_ValueError, "entity loader is not callable");
	return(NULL);
    }

    if (defaultExternalEntityLoader == NULL) 
	defaultExternalEntityLoader = xmlGetExternalEntityLoader();

    Py_XDECREF(pythonExternalEntityLoaderObjext);
    pythonExternalEntityLoaderObjext = loader;
    Py_XINCREF(pythonExternalEntityLoaderObjext);
    xmlSetExternalEntityLoader(pythonExternalEntityLoader);

    py_retval = PyLong_FromLong(0);
    return(py_retval);
}